

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O3

void __thiscall hmac_hash::SHA512::transform(SHA512 *this,uint8_t *message,size_t block_nb)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  uint8_t *puVar7;
  uint64_t *puVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  long local_318 [12];
  ulong local_2b8 [81];
  
  if (block_nb != 0) {
    puVar8 = this->m_h;
    puVar7 = message + 7;
    sVar6 = 0;
    do {
      lVar4 = 0;
      do {
        uVar9 = *(ulong *)(puVar7 + lVar4 * 8 + -7);
        local_2b8[lVar4] =
             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      uVar9 = local_2b8[0];
      do {
        uVar1 = local_2b8[lVar4 + 1];
        uVar2 = local_2b8[lVar4 + 0xe];
        local_2b8[lVar4 + 0x10] =
             (uVar1 >> 7 ^
             (uVar1 << 0x38 | uVar1 >> 8) ^ (uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f)) +
             uVar9 + (uVar2 >> 6 ^ (uVar2 << 3 | uVar2 >> 0x3d) ^ (uVar2 << 0x2d | uVar2 >> 0x13)) +
                     local_2b8[lVar4 + 9];
        lVar4 = lVar4 + 1;
        uVar9 = uVar1;
      } while (lVar4 != 0x40);
      local_318[6] = this->m_h[6];
      local_318[7] = this->m_h[7];
      local_318[4] = this->m_h[4];
      local_318[5] = this->m_h[5];
      local_318[1] = this->m_h[1];
      local_318[2] = this->m_h[2];
      local_318[3] = this->m_h[3];
      lVar4 = 0;
      uVar9 = this->m_h[5];
      uVar1 = *puVar8;
      uVar3 = this->m_h[2];
      uVar10 = this->m_h[7];
      uVar11 = this->m_h[3];
      do {
        local_318[2] = local_318[1];
        local_318[3] = uVar3;
        local_318[7] = local_318[6];
        local_318[5] = local_318[4];
        local_318[1] = uVar1;
        local_318[6] = uVar9;
        lVar5 = ((local_318[5] << 0x17 | (ulong)local_318[5] >> 0x29) ^
                (local_318[5] << 0x2e | (ulong)local_318[5] >> 0x12) ^
                (local_318[5] << 0x32 | (ulong)local_318[5] >> 0xe)) + uVar10 +
                *(long *)((long)&sha512_k + lVar4) +
                ((local_318[6] ^ local_318[7]) & local_318[5] ^ local_318[7]) +
                *(long *)((long)local_2b8 + lVar4);
        local_318[4] = uVar11 + lVar5;
        lVar4 = lVar4 + 8;
        uVar9 = local_318[5];
        uVar1 = (local_318[3] & local_318[2] ^ (local_318[3] ^ local_318[2]) & local_318[1]) +
                ((local_318[1] << 0x19 | (ulong)local_318[1] >> 0x27) ^
                (local_318[1] << 0x1e | (ulong)local_318[1] >> 0x22) ^
                (local_318[1] << 0x24 | (ulong)local_318[1] >> 0x1c)) + lVar5;
        uVar3 = local_318[2];
        uVar10 = local_318[7];
        uVar11 = local_318[3];
      } while (lVar4 != 0x280);
      lVar4 = 0;
      do {
        uVar3 = (puVar8 + lVar4)[1];
        lVar5 = local_318[lVar4 + 1];
        puVar8[lVar4] = puVar8[lVar4] + local_318[lVar4];
        (puVar8 + lVar4)[1] = uVar3 + lVar5;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 8);
      sVar6 = sVar6 + 1;
      puVar7 = puVar7 + 0x80;
    } while (sVar6 != block_nb);
  }
  return;
}

Assistant:

void SHA512::transform(const uint8_t *message, size_t block_nb) {
        uint64_t w[80];
        uint64_t wv[8];
        uint64_t t1, t2;
        const uint8_t *sub_block;
        size_t i, j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 7);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK64(&sub_block[j << 3], &w[j]);
            }
            for(j = 16; j < 80; ++j) {
                w[j] =  SHA512_F4(w[j -  2]) + w[j -  7] + SHA512_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 80; ++j) {
                t1 = wv[7] + SHA512_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha512_k[j] + w[j];
                t2 = SHA512_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }